

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

CharFormat testing::internal::PrintAsStringLiteralTo(wchar_t c,ostream *os)

{
  ostream *in_RSI;
  int in_EDI;
  ostream *in_stack_00000048;
  wchar_t in_stack_00000050;
  CharFormat local_4;
  
  if (in_EDI == 0x22) {
    std::operator<<(in_RSI,"\\\"");
    local_4 = kSpecialEscape;
  }
  else if (in_EDI == 0x27) {
    std::operator<<(in_RSI,"\'");
    local_4 = kAsIs;
  }
  else {
    local_4 = PrintAsCharLiteralTo<wchar_t,wchar_t>(in_stack_00000050,in_stack_00000048);
  }
  return local_4;
}

Assistant:

static CharFormat PrintAsStringLiteralTo(wchar_t c, ostream* os) {
  switch (c) {
    case L'\'':
      *os << "'";
      return kAsIs;
    case L'"':
      *os << "\\\"";
      return kSpecialEscape;
    default:
      return PrintAsCharLiteralTo<wchar_t>(c, os);
  }
}